

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O1

int CfdSetOptionFundRawTx
              (void *handle,void *fund_handle,int key,int64_t int64_value,double double_value,
              bool bool_value)

{
  CfdException *this;
  int local_5c;
  double local_58;
  undefined1 local_50 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  local_5c = key;
  local_58 = double_value;
  cfd::Initialize();
  local_50._0_8_ = &local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"FundRawTxData","");
  cfd::capi::CheckBuffer(fund_handle,(string *)local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._0_8_ != &local_40) {
    operator_delete((void *)local_50._0_8_,local_40._M_allocated_capacity + 1);
  }
  switch(local_5c) {
  case 1:
    *(bool *)((long)fund_handle + 0x68) = bool_value;
    break;
  case 2:
    *(double *)((long)fund_handle + 0x70) = local_58;
    break;
  case 3:
    *(double *)((long)fund_handle + 0x78) = local_58;
    break;
  case 4:
    *(int64_t *)((long)fund_handle + 0x80) = int64_value;
    break;
  case 5:
    *(int *)((long)fund_handle + 0x88) = (int)int64_value;
    break;
  case 6:
    if (-1 < int64_value) {
      *(int *)((long)fund_handle + 0x8c) = (int)int64_value;
    }
    break;
  default:
    local_50._0_8_ = "cfdcapi_transaction.cpp";
    local_50._8_4_ = 0xc9f;
    local_40._M_allocated_capacity = 0x630cc3;
    cfd::core::logger::log<int&>
              ((CfdSourceLocation *)local_50,kCfdLogLevelWarning,"illegal key {}.",&local_5c);
    this = (CfdException *)__cxa_allocate_exception(0x30);
    local_50._0_8_ = &local_40;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_50,"Failed to parameter. key is illegal.","");
    cfd::core::CfdException::CfdException(this,kCfdIllegalArgumentError,(string *)local_50);
    __cxa_throw(this,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  return 0;
}

Assistant:

int CfdSetOptionFundRawTx(
    void* handle, void* fund_handle, int key, int64_t int64_value,
    double double_value, bool bool_value) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(fund_handle, kPrefixFundRawTxData);
    CfdCapiFundRawTxData* buffer =
        static_cast<CfdCapiFundRawTxData*>(fund_handle);

    switch (key) {
      case kCfdFundTxIsBlind:
        buffer->is_blind = bool_value;
        break;
      case kCfdFundTxDustFeeRate:
        buffer->dust_fee_rate = double_value;
        break;
      case kCfdFundTxLongTermFeeRate:
        buffer->long_term_fee_rate = double_value;
        break;
      case kCfdFundTxKnapsackMinChange:
        buffer->knapsack_min_change = int64_value;
        break;
      case kCfdFundTxBlindExponent:
        buffer->exponent = static_cast<int>(int64_value);
        break;
      case kCfdFundTxBlindMinimumBits:
        if (int64_value >= 0) {
          buffer->minimum_bits = static_cast<int>(int64_value);
        }
        break;
      default:
        warn(CFD_LOG_SOURCE, "illegal key {}.", key);
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to parameter. key is illegal.");
    }

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}